

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

pointer __thiscall
slang::SmallVectorBase<slang::ast::SystemTimingCheckSymbol::Arg>::emplaceRealloc<>
          (SmallVectorBase<slang::ast::SystemTimingCheckSymbol::Arg> *this,pointer pos)

{
  undefined8 *puVar1;
  ulong uVar2;
  pointer p;
  Expression *pEVar3;
  Expression *pEVar4;
  pointer paVar5;
  undefined4 uVar6;
  pointer pAVar7;
  long lVar8;
  pointer pAVar9;
  pointer pAVar10;
  long lVar11;
  size_type sVar12;
  ulong uVar13;
  
  if (this->len == 0x333333333333333) {
    detail::throwLengthError();
  }
  uVar13 = this->len + 1;
  uVar2 = this->cap;
  if (uVar13 < uVar2 * 2) {
    uVar13 = uVar2 * 2;
  }
  if (0x333333333333333 - uVar2 < uVar2) {
    uVar13 = 0x333333333333333;
  }
  lVar11 = (long)pos - (long)this->data_;
  pAVar7 = (pointer)operator_new(uVar13 * 0x28);
  *(undefined8 *)((long)pAVar7 + lVar11) = 0;
  ((undefined8 *)((long)pAVar7 + lVar11))[1] = 0;
  puVar1 = (undefined8 *)((long)pAVar7 + lVar11 + 0x10);
  *puVar1 = 0;
  puVar1[1] = 0;
  *(undefined8 *)((long)pAVar7 + lVar11 + 0x20) = 0;
  p = this->data_;
  sVar12 = this->len;
  lVar8 = (long)p + (sVar12 * 0x28 - (long)pos);
  pAVar9 = p;
  pAVar10 = pAVar7;
  if (lVar8 == 0) {
    pAVar9 = pAVar7;
    pAVar10 = p;
    if (sVar12 != 0) {
      do {
        (pAVar9->edgeDescriptors)._M_extent._M_extent_value =
             (pAVar10->edgeDescriptors)._M_extent._M_extent_value;
        pEVar3 = pAVar10->expr;
        pEVar4 = pAVar10->condition;
        uVar6 = *(undefined4 *)&pAVar10->field_0x14;
        paVar5 = (pAVar10->edgeDescriptors)._M_ptr;
        pAVar9->edge = pAVar10->edge;
        *(undefined4 *)&pAVar9->field_0x14 = uVar6;
        (pAVar9->edgeDescriptors)._M_ptr = paVar5;
        pAVar9->expr = pEVar3;
        pAVar9->condition = pEVar4;
        pAVar10 = pAVar10 + 1;
        pAVar9 = pAVar9 + 1;
      } while (pAVar10 != pos);
    }
  }
  else {
    for (; pAVar9 != pos; pAVar9 = pAVar9 + 1) {
      (pAVar10->edgeDescriptors)._M_extent._M_extent_value =
           (pAVar9->edgeDescriptors)._M_extent._M_extent_value;
      pEVar3 = pAVar9->expr;
      pEVar4 = pAVar9->condition;
      uVar6 = *(undefined4 *)&pAVar9->field_0x14;
      paVar5 = (pAVar9->edgeDescriptors)._M_ptr;
      pAVar10->edge = pAVar9->edge;
      *(undefined4 *)&pAVar10->field_0x14 = uVar6;
      (pAVar10->edgeDescriptors)._M_ptr = paVar5;
      pAVar10->expr = pEVar3;
      pAVar10->condition = pEVar4;
      pAVar10 = pAVar10 + 1;
    }
    memcpy((void *)((long)pAVar7 + lVar11 + 0x28),pos,((lVar8 - 0x28U) / 0x28) * 0x28 + 0x28);
  }
  if (p != (pointer)this->firstElement) {
    operator_delete(p);
    sVar12 = this->len;
  }
  this->len = sVar12 + 1;
  this->cap = uVar13;
  this->data_ = pAVar7;
  return (pointer)((long)pAVar7 + lVar11);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}